

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_go_down(command *cmd)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t local_14;
  wchar_t descend_to;
  command *cmd_local;
  
  local_14 = dungeon_get_next_level(player,(int)player->depth,L'\x01');
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  _Var1 = square_isdownstairs((chunk *)cave,grid);
  if (_Var1) {
    if ((int)player->depth == z_info->max_depth - 1) {
      msg("The dungeon does not appear to extend deeper");
    }
    else {
      if (((player->opts).opt[0x20] & 1U) != 0) {
        local_14 = dungeon_get_next_level(player,(int)player->max_depth,L'\x01');
        _Var1 = is_quest(player,local_14);
        if ((_Var1) && (_Var1 = get_check("Are you sure you want to descend? "), !_Var1)) {
          return;
        }
      }
      player->upkeep->energy_use = (uint)z_info->move_energy;
      msgt(0x1d,"You enter a maze of down staircases.");
      player->upkeep->create_up_stair = true;
      player->upkeep->create_down_stair = false;
      dungeon_change_level(player,local_14);
    }
  }
  else {
    do_cmd_navigate_down(cmd);
  }
  return;
}

Assistant:

void do_cmd_go_down(struct command *cmd)
{
	int descend_to = dungeon_get_next_level(player, player->depth, 1);

	/* Verify stairs */
	if (!square_isdownstairs(cave, player->grid)) {
		do_cmd_navigate_down(cmd);
		return;
	}

	/* Paranoia, no descent from z_info->max_depth - 1 */
	if (player->depth == z_info->max_depth - 1) {
		msg("The dungeon does not appear to extend deeper");
		return;
	}

	/* Warn a force_descend player if they're going to a quest level */
	if (OPT(player, birth_force_descend)) {
		descend_to = dungeon_get_next_level(player,
			player->max_depth, 1);
		if (is_quest(player, descend_to) &&
			!get_check("Are you sure you want to descend? "))
			return;
	}

	/* Hack -- take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Success */
	msgt(MSG_STAIRS_DOWN, "You enter a maze of down staircases.");

	/* Create a way back */
	player->upkeep->create_up_stair = true;
	player->upkeep->create_down_stair = false;

	/* Change level */
	dungeon_change_level(player, descend_to);
}